

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.h
# Opt level: O2

void JitFFI::OpCode_x64::movd_u32(JitFuncCreater *jfc,Register r,uint32_t dat)

{
  if ((r & ~r15) == eax) {
    if ((~r & 0x18) == 0) {
      JitFuncCreater::push(jfc,'A');
    }
    JitFuncCreater::push(jfc,(byte)r | 0xb8);
    JitFuncCreater::push_uint32(jfc,dat);
    return;
  }
  __assert_fail("is_rxd(r)",
                "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/include/opcode.h"
                ,0x21f,"void JitFFI::OpCode_x64::movd_u32(JitFuncCreater &, Register, uint32_t)");
}

Assistant:

inline bool is_rxd1(Register r) { return r8d <= r && r <= r15d; }